

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O0

Builder * capnp::compiler::anon_unknown_0::initMemberDecl
                    (Builder *__return_storage_ptr__,Builder builder,
                    Located<capnp::Text::Reader> *name,
                    Orphan<capnp::compiler::LocatedInteger> *ordinal,
                    Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>
                    *annotations)

{
  Builder builder_00;
  Orphan<capnp::compiler::LocatedInteger> *value;
  size_t sVar1;
  Orphan<capnp::compiler::Declaration::AnnotationApplication> *pOVar2;
  uint local_9c;
  undefined1 local_98 [4];
  uint i;
  Builder list;
  Builder local_48;
  Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *local_20;
  Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *annotations_local;
  Orphan<capnp::compiler::LocatedInteger> *ordinal_local;
  Located<capnp::Text::Reader> *name_local;
  
  local_20 = annotations;
  annotations_local =
       (Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *)ordinal;
  ordinal_local = (Orphan<capnp::compiler::LocatedInteger> *)name;
  Declaration::Builder::initName(&local_48,&builder);
  builder_00._builder.capTable = local_48._builder.capTable;
  builder_00._builder.segment = local_48._builder.segment;
  builder_00._builder.data = local_48._builder.data;
  builder_00._builder.pointers = local_48._builder.pointers;
  builder_00._builder.dataSize = local_48._builder.dataSize;
  builder_00._builder.pointerCount = local_48._builder.pointerCount;
  builder_00._builder._38_2_ = local_48._builder._38_2_;
  Located<capnp::Text::Reader>::copyTo<capnp::compiler::LocatedText::Builder>(name,builder_00);
  Declaration::Builder::getId((Builder *)&list.builder.structDataSize,&builder);
  value = kj::mv<capnp::Orphan<capnp::compiler::LocatedInteger>>
                    ((Orphan<capnp::compiler::LocatedInteger> *)annotations_local);
  Declaration::Id::Builder::adoptOrdinal((Builder *)&list.builder.structDataSize,value);
  sVar1 = kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::size
                    (local_20);
  Declaration::Builder::initAnnotations((Builder *)local_98,&builder,(uint)sVar1);
  local_9c = 0;
  while( true ) {
    sVar1 = kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::size
                      (local_20);
    if (sVar1 <= local_9c) break;
    pOVar2 = kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::
             operator[](local_20,(ulong)local_9c);
    pOVar2 = kj::mv<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>(pOVar2);
    List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Builder::
    adoptWithCaveats((Builder *)local_98,local_9c,pOVar2);
    local_9c = local_9c + 1;
  }
  memcpy(__return_storage_ptr__,&builder,0x28);
  return __return_storage_ptr__;
}

Assistant:

static Declaration::Builder initMemberDecl(
    Declaration::Builder builder, Located<Text::Reader>&& name,
    Orphan<LocatedInteger>&& ordinal,
    kj::Array<Orphan<Declaration::AnnotationApplication>>&& annotations) {
  name.copyTo(builder.initName());
  builder.getId().adoptOrdinal(kj::mv(ordinal));
  auto list = builder.initAnnotations(annotations.size());
  for (uint i = 0; i < annotations.size(); i++) {
    list.adoptWithCaveats(i, kj::mv(annotations[i]));
  }
  return builder;
}